

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::TestCaseTracking::SectionTracker::SectionTracker
          (SectionTracker *this,NameAndLocation *nameAndLocation,TrackerContext *ctx,
          ITracker *parent)

{
  int iVar1;
  undefined4 extraout_var;
  
  TrackerBase::TrackerBase(&this->super_TrackerBase,nameAndLocation,ctx,parent);
  (this->super_TrackerBase).super_ITracker._vptr_ITracker =
       (_func_int **)&PTR__SectionTracker_0017b920;
  (this->m_filters).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_filters).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_filters).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  trim(&this->m_trimmed_name,&nameAndLocation->name);
  if (parent != (ITracker *)0x0) {
    while( true ) {
      iVar1 = (*parent->_vptr_ITracker[0xe])(parent);
      if ((char)iVar1 != '\0') break;
      iVar1 = (*parent->_vptr_ITracker[7])(parent);
      parent = (ITracker *)CONCAT44(extraout_var,iVar1);
    }
    addNextFilters(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&parent[1].m_nameAndLocation.location.line);
  }
  return;
}

Assistant:

SectionTracker::SectionTracker( NameAndLocation const& nameAndLocation, TrackerContext& ctx, ITracker* parent )
    :   TrackerBase( nameAndLocation, ctx, parent ),
        m_trimmed_name(trim(nameAndLocation.name))
    {
        if( parent ) {
            while( !parent->isSectionTracker() )
                parent = &parent->parent();

            SectionTracker& parentSection = static_cast<SectionTracker&>( *parent );
            addNextFilters( parentSection.m_filters );
        }
    }